

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

LocalSet * __thiscall wasm::DataFlow::Graph::getSet(Graph *this,Node *node)

{
  iterator iVar1;
  LocalSet *pLVar2;
  Node *local_10;
  Node *node_local;
  
  local_10 = node;
  iVar1 = std::
          _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->nodeParentMap)._M_h,&local_10);
  if (iVar1.
      super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pLVar2 = (LocalSet *)0x0;
  }
  else {
    pLVar2 = (LocalSet *)0x0;
    if (((*(LocalSet **)
           ((long)iVar1.
                  super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
                  ._M_cur + 0x10))->super_SpecificExpression<(wasm::Expression::Id)9>).
        super_Expression._id == LocalSetId) {
      pLVar2 = *(LocalSet **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_false>
                       ._M_cur + 0x10);
    }
  }
  return pLVar2;
}

Assistant:

LocalSet* getSet(Node* node) {
    auto iter = nodeParentMap.find(node);
    if (iter == nodeParentMap.end()) {
      return nullptr;
    }
    return iter->second->dynCast<LocalSet>();
  }